

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

int __thiscall lsim::Simulator::init(Simulator *this,EVP_PKEY_CTX *ctx)

{
  pointer puVar1;
  pointer puVar2;
  pointer pNVar3;
  pointer puVar4;
  iterator iVar5;
  pointer ppSVar6;
  iterator __position;
  uint *puVar7;
  long lVar8;
  int extraout_EAX;
  ulong uVar9;
  pointer pVVar10;
  _Any_data *p_Var11;
  pointer puVar12;
  int iVar13;
  pointer pVVar14;
  uint *puVar15;
  _Any_data *this_00;
  _Any_data *p_Var16;
  pointer ppSVar17;
  long lVar18;
  pointer ppSVar19;
  NodeMetadata *meta;
  pointer pNVar20;
  pointer puVar21;
  long lVar22;
  uint uStack_bc;
  _Any_data *p_Stack_b8;
  pointer ppSStack_b0;
  pointer ppSStack_a8;
  _Any_data **pp_Stack_a0;
  SimComponent **ppSStack_98;
  _Any_data *p_Stack_88;
  SimComponent *pSStack_80;
  uint *puStack_78;
  vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>> *pvStack_70;
  Simulator *pSStack_68;
  pointer ppSStack_60;
  pointer ppSStack_58;
  undefined1 *puStack_50;
  SimComponent **ppSStack_48;
  Simulator *local_38;
  SimComponent *local_30;
  
  this->m_time = 1;
  pVVar10 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar14 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar10 != pVVar14) {
    memset(pVVar10,0,((long)pVVar14 + (-4 - (long)pVVar10) & 0xfffffffffffffffcU) + 4);
  }
  pVVar10 = (this->m_node_values_write).
            super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar14 = (this->m_node_values_write).
            super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pVVar10 != pVVar14) {
    memset(pVVar10,0,((long)pVVar14 + (-4 - (long)pVVar10) & 0xfffffffffffffffcU) + 4);
  }
  puVar1 = (this->m_node_write_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_node_write_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    memset(puVar1,0,((long)puVar2 + (-8 - (long)puVar1) & 0xfffffffffffffff8U) + 8);
  }
  puVar1 = (this->m_node_change_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_node_change_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    memset(puVar1,0,((long)puVar2 + (-8 - (long)puVar1) & 0xfffffffffffffff8U) + 8);
  }
  puVar1 = (this->m_input_changed).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_input_changed).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    memset(puVar1,0,((long)puVar2 + (-8 - (long)puVar1) & 0xfffffffffffffff8U) + 8);
  }
  pNVar3 = (this->m_node_metadata).
           super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar20 = (this->m_node_metadata).
                 super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl
                 .super__Vector_impl_data._M_start; pNVar20 != pNVar3; pNVar20 = pNVar20 + 1) {
    pNVar20->m_default = VALUE_UNDEFINED;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(pNVar20->m_active_pins)._M_t);
    pNVar20->m_time_dirty_write = 0;
  }
  puVar4 = (this->m_components).
           super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (this->m_components).
                 super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar4; puVar21 = puVar21 + 1
      ) {
    SimComponent::apply_initial_values
              ((puVar21->_M_t).
               super___uniq_ptr_impl<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>.
               _M_t.
               super__Tuple_impl<0UL,_lsim::SimComponent_*,_std::default_delete<lsim::SimComponent>_>
               .super__Head_base<0UL,_lsim::SimComponent_*,_false>._M_head_impl);
  }
  ppSVar17 = (this->m_init_components).
             super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppSVar19 = (this->m_init_components).
             super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (ppSVar17 != ppSVar19) {
    do {
      local_30 = *ppSVar17;
      uVar9 = (ulong)local_30->m_comp_desc->m_type;
      this_00 = (_Any_data *)
                (this->m_sim_functions).
                super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_38 = this;
      if (*(long *)(this_00 + uVar9 * 6 + 1) == 0) {
        std::__throw_bad_function_call();
        ppSVar6 = *(pointer *)
                   &(((component_refs_t *)(this_00->_M_pod_data + 0x68))->
                    super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>)
                    ._M_impl;
        lVar18 = *(long *)this_00 + 1;
        *(long *)this_00 = lVar18;
        if (*(pointer *)(this_00->_M_pod_data + 0x70) != ppSVar6) {
          *(pointer *)(this_00->_M_pod_data + 0x70) = ppSVar6;
        }
        puVar15 = *(uint **)&(((node_container_t *)(this_00->_M_pod_data + 0x110))->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl;
        puStack_78 = *(uint **)(this_00->_M_pod_data + 0x118);
        p_Var16 = this_00;
        pSStack_68 = this;
        ppSStack_60 = ppSVar17;
        ppSStack_58 = ppSVar19;
        puStack_50 = (undefined1 *)&local_38;
        ppSStack_48 = &local_30;
        if (puVar15 == puStack_78) goto LAB_00116220;
        pvStack_70 = (vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>> *)
                     (this_00->_M_pod_data + 0x68);
        puStack_50 = (undefined1 *)&local_38;
        do {
          lVar22 = *(long *)&(((node_metadata_container_t *)(this_00->_M_pod_data + 0xb0))->
                             super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>
                             )._M_impl;
          lVar8 = lVar22 + (ulong)*puVar15 * 0x88 + 0x10;
          p_Var11 = *(_Any_data **)(lVar22 + (ulong)*puVar15 * 0x88 + 0x20);
          if (p_Var11 != (_Any_data *)lVar8) {
            lVar22 = *(long *)&(((timestamp_container_t *)(this_00->_M_pod_data + 0x20))->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl;
            do {
              p_Var16 = p_Var11;
              p_Stack_88 = *(_Any_data **)
                            &(((timestamp_container_t *)(p_Var16->_M_pod_data + 0x20))->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl;
              if (*(long *)(lVar22 + (ulong)*(uint *)(p_Stack_88->_M_pod_data + 0x10) * 8) != lVar18
                 ) {
                __position._M_current = *(SimComponent ***)(this_00->_M_pod_data + 0x70);
                if (__position._M_current == *(SimComponent ***)(this_00->_M_pod_data + 0x78)) {
                  ppSStack_98 = (SimComponent **)0x11618d;
                  std::vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>>::
                  _M_realloc_insert<lsim::SimComponent*const&>
                            (pvStack_70,__position,(SimComponent **)&p_Stack_88);
                  lVar18 = *(long *)this_00;
                }
                else {
                  *__position._M_current = (SimComponent *)p_Stack_88;
                  *(pointer *)(this_00->_M_pod_data + 0x70) =
                       *(pointer *)(this_00->_M_pod_data + 0x70) + 1;
                }
                lVar22 = *(long *)&(((timestamp_container_t *)(this_00->_M_pod_data + 0x20))->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl;
                *(long *)(lVar22 + (ulong)*(uint *)(p_Stack_88->_M_pod_data + 0x10) * 8) = lVar18;
              }
              ppSStack_98 = (SimComponent **)0x1161a8;
              p_Var11 = (_Any_data *)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var16);
            } while (p_Var11 != (_Any_data *)lVar8);
          }
          puVar15 = puVar15 + 1;
        } while (puVar15 != puStack_78);
        ppSVar17 = *(pointer *)
                    &(((component_refs_t *)(this_00->_M_pod_data + 0x68))->
                     super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>
                     )._M_impl;
        ppSVar19 = *(pointer *)(this_00->_M_pod_data + 0x70);
        if (ppSVar17 == ppSVar19) {
LAB_00116220:
          ppSVar17 = *(pointer *)
                      &(((component_refs_t *)(this_00->_M_pod_data + 0x50))->
                       super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>
                       )._M_impl;
          ppSVar19 = *(pointer *)(this_00->_M_pod_data + 0x58);
          if (ppSVar17 == ppSVar19) {
LAB_0011627d:
            puVar12 = *(pointer *)
                       &(((node_container_t *)(this_00->_M_pod_data + 0x110))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
            if (*(pointer *)(this_00->_M_pod_data + 0x118) != puVar12) {
              *(pointer *)(this_00->_M_pod_data + 0x118) = puVar12;
            }
            ppSStack_98 = (SimComponent **)0x11629c;
            postprocess_dirty_nodes((Simulator *)this_00);
            return extraout_EAX;
          }
          while( true ) {
            pSStack_80 = *ppSVar17;
            uVar9 = (ulong)pSStack_80->m_comp_desc->m_type;
            lVar18 = *(long *)&(((sim_func_container_t *)(this_00->_M_pod_data + 0x170))->
                               super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
                               )._M_impl;
            if (*(long *)(lVar18 + uVar9 * 0x60 + 0x50) == 0) break;
            p_Var16 = (_Any_data *)(lVar18 + uVar9 * 0x60 + 0x40);
            ppSStack_98 = (SimComponent **)0x116274;
            p_Stack_88 = this_00;
            (**(code **)(lVar18 + uVar9 * 0x60 + 0x58))
                      (p_Var16,(Simulator **)&p_Stack_88,&pSStack_80);
            ppSVar17 = ppSVar17 + 1;
            if (ppSVar17 == ppSVar19) goto LAB_0011627d;
          }
        }
        else {
          while( true ) {
            pSStack_80 = *ppSVar17;
            uVar9 = (ulong)pSStack_80->m_comp_desc->m_type;
            lVar18 = *(long *)&(((sim_func_container_t *)(this_00->_M_pod_data + 0x170))->
                               super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
                               )._M_impl;
            if (*(long *)(lVar18 + uVar9 * 0x60 + 0x30) == 0) break;
            p_Var16 = (_Any_data *)(lVar18 + uVar9 * 0x60 + 0x20);
            ppSStack_98 = (SimComponent **)0x116217;
            p_Stack_88 = this_00;
            (**(code **)(lVar18 + uVar9 * 0x60 + 0x38))
                      (p_Var16,(Simulator **)&p_Stack_88,&pSStack_80);
            ppSVar17 = ppSVar17 + 1;
            if (ppSVar17 == ppSVar19) goto LAB_00116220;
          }
        }
        ppSStack_98 = (SimComponent **)postprocess_dirty_nodes;
        p_Stack_88 = this_00;
        puVar12 = (pointer)std::__throw_bad_function_call();
        puVar15 = *(uint **)&(((node_container_t *)(p_Var16->_M_pod_data + 0x128))->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl;
        puVar7 = *(uint **)(p_Var16->_M_pod_data + 0x130);
        if (puVar15 == puVar7) goto LAB_001163c8;
        p_Stack_b8 = this_00;
        ppSStack_b0 = ppSVar17;
        ppSStack_a8 = ppSVar19;
        pp_Stack_a0 = &p_Stack_88;
        ppSStack_98 = &pSStack_80;
        do {
          uStack_bc = *puVar15;
          uVar9 = (ulong)uStack_bc;
          lVar22 = *(long *)&(((node_metadata_container_t *)(p_Var16->_M_pod_data + 0xb0))->
                             super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>
                             )._M_impl;
          lVar18 = lVar22 + uVar9 * 0x88;
          lVar22 = *(long *)(lVar22 + uVar9 * 0x88 + 0x78);
          if (lVar22 == 1) {
            iVar13 = *(int *)(*(long *)&(((value_container_t *)(p_Var16->_M_pod_data + 0x98))->
                                        super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
                                        )._M_impl +
                             (ulong)*(uint *)(*(long *)(lVar18 + 0x68) + 0x20) * 4);
            *(int *)(*(long *)&(((value_container_t *)(p_Var16->_M_pod_data + 0xf8))->
                               super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>).
                               _M_impl + uVar9 * 4) = iVar13;
LAB_0011633a:
            *(undefined8 *)
             (*(long *)&(((timestamp_container_t *)(p_Var16->_M_pod_data + 0x140))->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl +
             uVar9 * 8) = *(undefined8 *)p_Var16;
          }
          else {
            if (lVar22 == 0) {
              iVar13 = *(int *)lVar18;
              *(int *)(*(long *)&(((value_container_t *)(p_Var16->_M_pod_data + 0xf8))->
                                 super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>).
                                 _M_impl + uVar9 * 4) = iVar13;
              goto LAB_0011633a;
            }
            *(undefined4 *)
             (*(long *)&(((value_container_t *)(p_Var16->_M_pod_data + 0xf8))->
                        super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl +
             uVar9 * 4) = 3;
            iVar13 = 3;
          }
          lVar18 = *(long *)&(((value_container_t *)(p_Var16->_M_pod_data + 0xe0))->
                             super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl;
          if (*(int *)(lVar18 + uVar9 * 4) != iVar13) {
            *(undefined8 *)
             (*(long *)&(((timestamp_container_t *)(p_Var16->_M_pod_data + 0x158))->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl +
             uVar9 * 8) = *(undefined8 *)p_Var16;
            *(int *)(lVar18 + uVar9 * 4) = iVar13;
            iVar5._M_current = *(uint **)(p_Var16->_M_pod_data + 0x118);
            if (iVar5._M_current == *(uint **)(p_Var16->_M_pod_data + 0x120)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         (p_Var16->_M_pod_data + 0x110),iVar5,&uStack_bc);
            }
            else {
              *iVar5._M_current = uStack_bc;
              *(uint **)(p_Var16->_M_pod_data + 0x118) = iVar5._M_current + 1;
            }
          }
          puVar15 = puVar15 + 1;
          if (puVar15 == puVar7) {
            puVar12 = *(pointer *)
                       &(((node_container_t *)(p_Var16->_M_pod_data + 0x128))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
            if (*(pointer *)(p_Var16->_M_pod_data + 0x130) != puVar12) {
              *(pointer *)(p_Var16->_M_pod_data + 0x130) = puVar12;
            }
LAB_001163c8:
            return (int)puVar12;
          }
        } while( true );
      }
      (**(code **)((long)(this_00 + uVar9 * 6) + 0x18))(this_00 + uVar9 * 6,&local_38,&local_30);
      ppSVar17 = ppSVar17 + 1;
    } while (ppSVar17 != ppSVar19);
  }
  local_38 = (Simulator *)((ulong)local_38 & 0xffffffff00000000);
  pVVar10 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar14 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar14 != pVVar10) {
    uVar9 = 0;
    do {
      iVar5._M_current =
           (this->m_dirty_nodes_read).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_dirty_nodes_read).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_dirty_nodes_read,
                   iVar5,(uint *)&local_38);
        pVVar10 = (this->m_node_values_read).
                  super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar14 = (this->m_node_values_read).
                  super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        *iVar5._M_current = (uint)uVar9;
        (this->m_dirty_nodes_read).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      uVar9 = (ulong)((int)local_38 + 1U);
      local_38 = (Simulator *)CONCAT44(local_38._4_4_,(int)local_38 + 1U);
    } while (uVar9 < (ulong)((long)pVVar14 - (long)pVVar10 >> 2));
  }
  return (int)pVVar10;
}

Assistant:

void Simulator::init() {
    m_time = 1;

    std::fill(std::begin(m_node_values_read), std::end(m_node_values_read), VALUE_FALSE);
    std::fill(std::begin(m_node_values_write), std::end(m_node_values_write), VALUE_FALSE);
    std::fill(std::begin(m_node_write_time), std::end(m_node_write_time), 0);
    std::fill(std::begin(m_node_change_time), std::end(m_node_change_time), 0);
	std::fill(std::begin(m_input_changed), std::end(m_input_changed), 0);

    for (auto &meta : m_node_metadata) {
        meta.m_default = VALUE_UNDEFINED;
		meta.m_active_pins.clear();
		meta.m_time_dirty_write = 0;
    }

    // apply initial values
    for (auto &comp : m_components) {
		comp->apply_initial_values();
    }

    // run one time setup functions
    for (auto comp : m_init_components) {
        auto &setup_func = m_sim_functions[comp->description()->type()][SIM_FUNCTION_SETUP];
        setup_func(this, comp);
    }

    // mark all nodes as dirty for the first run
    for (node_t node = 0; node < m_node_values_read.size(); ++node) {
        m_dirty_nodes_read.push_back(node);
    }
}